

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

int Saig_ManRetimeCountCut(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  Aig_Obj_t *pObj;
  Vec_Ptr_t *p_00;
  void *pvVar1;
  int iVar2;
  int i;
  void *Entry;
  int iVar3;
  
  Aig_ManIncrementTravId(p);
  for (iVar2 = 0; iVar2 < vCut->nSize; iVar2 = iVar2 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vCut,iVar2);
    Saig_ManMarkCone_rec(p,pObj);
  }
  p_00 = Vec_PtrAlloc(1000);
  for (iVar2 = 0; iVar2 < p->vObjs->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,iVar2);
    if ((pvVar1 != (void *)0x0) && (*(int *)((long)pvVar1 + 0x20) != p->nTravIds)) {
      Entry = (void *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe);
      if ((Entry != (void *)0x0) &&
         (((*(byte *)((long)Entry + 0x18) & 0x10) == 0 &&
          (*(int *)((long)Entry + 0x20) == p->nTravIds)))) {
        Vec_PtrPush(p_00,Entry);
        *(byte *)((long)Entry + 0x18) = *(byte *)((long)Entry + 0x18) | 0x10;
      }
      pvVar1 = (void *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe);
      if (((pvVar1 != (void *)0x0) && ((*(byte *)((long)pvVar1 + 0x18) & 0x10) == 0)) &&
         (*(int *)((long)pvVar1 + 0x20) == p->nTravIds)) {
        Vec_PtrPush(p_00,pvVar1);
        *(byte *)((long)pvVar1 + 0x18) = *(byte *)((long)pvVar1 + 0x18) | 0x10;
      }
    }
  }
  iVar2 = p_00->nSize;
  iVar3 = 0;
  i = 0;
  if (0 < iVar2) {
    iVar3 = iVar2;
    i = 0;
  }
  for (; iVar3 != i; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p_00,i);
    *(byte *)((long)pvVar1 + 0x18) = *(byte *)((long)pvVar1 + 0x18) & 0xef;
  }
  Vec_PtrFree(p_00);
  return iVar2;
}

Assistant:

int Saig_ManRetimeCountCut( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pFanin;
    int i, RetValue;
    // mark the cones
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        Saig_ManMarkCone_rec( p, pObj );
    // collect the new cut
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        pFanin = Aig_ObjFanin0( pObj );
        if ( pFanin && !pFanin->fMarkA && Aig_ObjIsTravIdCurrent(p, pFanin) )
        {
            Vec_PtrPush( vNodes, pFanin );
            pFanin->fMarkA = 1;
        }
        pFanin = Aig_ObjFanin1( pObj );
        if ( pFanin && !pFanin->fMarkA && Aig_ObjIsTravIdCurrent(p, pFanin) )
        {
            Vec_PtrPush( vNodes, pFanin );
            pFanin->fMarkA = 1;
        }
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->fMarkA = 0;
    RetValue = Vec_PtrSize( vNodes );
    Vec_PtrFree( vNodes );
    return RetValue;
}